

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

void __thiscall CaDiCaL::Solver::trace_api_calls(Solver *this,FILE *file)

{
  char *in_RCX;
  Solver *name;
  
  name = this;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"void CaDiCaL::Solver::trace_api_calls(FILE *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  if (this->external == (External *)0x0) {
    trace_api_calls();
LAB_0083c3c1:
    trace_api_calls();
LAB_0083c3c6:
    trace_api_calls();
LAB_0083c3cb:
    trace_api_calls();
  }
  else {
    if (this->internal == (Internal *)0x0) goto LAB_0083c3c1;
    if ((this->_state & VALID) == 0) goto LAB_0083c3c6;
    if (file == (FILE *)0x0) goto LAB_0083c3cb;
    if (tracing_api_calls_through_environment_variable_method != '\x01') {
      if (this->trace_api_file == (FILE *)0x0) {
        this->trace_api_file = file;
        fprintf((FILE *)file,"%s\n","init");
        fflush((FILE *)this->trace_api_file);
        return;
      }
      goto LAB_0083c3d5;
    }
  }
  trace_api_calls();
LAB_0083c3d5:
  trace_api_calls();
  Options::has(&name->adding_clause);
  return;
}

Assistant:

void Solver::trace_api_calls (FILE *file) {
  LOG_API_CALL_BEGIN ("trace_api_calls");
  REQUIRE_VALID_STATE ();
  REQUIRE (file != 0, "invalid zero file argument");
  REQUIRE (!tracing_api_calls_through_environment_variable_method,
           "already tracing API calls "
           "using environment variable 'CADICAL_API_TRACE'");
  REQUIRE (!trace_api_file, "called twice");
  trace_api_file = file;
  LOG_API_CALL_END ("trace_api_calls");
  trace_api_call ("init");
}